

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 Decompress_BitPacking_8
                (UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmpParams)

{
  byte bVar1;
  UINT8 UVar2;
  UINT8 UVar3;
  ushort uVar4;
  undefined1 auVar5 [12];
  FUINT8 FVar6;
  char cVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  UINT8 *pUVar11;
  short local_72;
  ushort local_6e;
  FUINT8 outBit;
  FUINT8 bitMask;
  FUINT8 inValB;
  FUINT8 bitReadVal;
  FUINT8 bitsToRead;
  UINT8 *ent1B;
  FUINT8 outShift;
  FUINT8 inShift;
  FUINT8 outVal;
  FUINT8 inVal;
  UINT8 *outDataEnd;
  UINT8 *pUStack_48;
  UINT32 outLenMax;
  UINT8 *outPos;
  UINT8 *inPos;
  FUINT8 addVal;
  FUINT8 bitsCmp;
  PCM_CMP_INF *cmpParams_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  UINT8 *outData_local;
  UINT32 outLen_local;
  
  bVar1 = cmpParams->bitsCmp;
  uVar8 = (ushort)bVar1;
  _bitMask = (UINT8 *)0x0;
  if (cmpParams->subType == '\x02') {
    _bitMask = (cmpParams->comprTbl->values).d8;
    if (cmpParams->comprTbl->valueCount == 0) {
      return '\x10';
    }
    if ((cmpParams->bitsDec != cmpParams->comprTbl->bitsDec) ||
       (cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)) {
      return '\x11';
    }
  }
  ent1B._2_2_ = 0;
  UVar2 = cmpParams->bitsDec;
  auVar5._4_8_ = 0;
  auVar5._0_4_ = inLen;
  uVar10 = SUB124((auVar5 << 3) / ZEXT112(cmpParams->bitsCmp),0);
  outData_local._0_4_ = outLen;
  if (uVar10 < outLen) {
    outData_local._0_4_ = uVar10;
  }
  pUVar11 = outData + (UINT32)outData_local;
  UVar3 = cmpParams->subType;
  cVar7 = (char)cmpParams->baseVal;
  pUStack_48 = outData;
  outPos = inData;
  if (UVar3 == '\0') {
    for (; pUStack_48 < pUVar11; pUStack_48 = pUStack_48 + 1) {
      local_72 = 0;
      ent1B._6_2_ = 0;
      outBit = uVar8;
      while (outBit != 0) {
        FVar6 = outBit;
        if (7 < outBit) {
          FVar6 = 8;
        }
        outBit = outBit - FVar6;
        uVar9 = (short)(1 << ((byte)FVar6 & 0x1f)) - 1;
        ent1B._2_2_ = ent1B._2_2_ + FVar6;
        uVar4 = (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8);
        local_6e = uVar4 & uVar9;
        if (7 < ent1B._2_2_) {
          ent1B._2_2_ = ent1B._2_2_ - 8;
          outPos = outPos + 1;
          if (ent1B._2_2_ != 0) {
            local_6e = uVar9 & (uVar4 | (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8)
                               );
          }
        }
        ent1B._6_2_ = ent1B._6_2_ | local_6e << ((byte)local_72 & 0x1f);
        local_72 = local_72 + FVar6;
      }
      *pUStack_48 = (char)ent1B._6_2_ + cVar7;
    }
  }
  else if (UVar3 == '\x01') {
    for (; pUStack_48 < pUVar11; pUStack_48 = pUStack_48 + 1) {
      local_72 = 0;
      ent1B._6_2_ = 0;
      outBit = uVar8;
      while (outBit != 0) {
        FVar6 = outBit;
        if (7 < outBit) {
          FVar6 = 8;
        }
        outBit = outBit - FVar6;
        uVar9 = (short)(1 << ((byte)FVar6 & 0x1f)) - 1;
        ent1B._2_2_ = ent1B._2_2_ + FVar6;
        uVar4 = (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8);
        local_6e = uVar4 & uVar9;
        if (7 < ent1B._2_2_) {
          ent1B._2_2_ = ent1B._2_2_ - 8;
          outPos = outPos + 1;
          if (ent1B._2_2_ != 0) {
            local_6e = uVar9 & (uVar4 | (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8)
                               );
          }
        }
        ent1B._6_2_ = ent1B._6_2_ | local_6e << ((byte)local_72 & 0x1f);
        local_72 = local_72 + FVar6;
      }
      *pUStack_48 = (char)(ent1B._6_2_ << (UVar2 - bVar1 & 0x1f)) + cVar7;
    }
  }
  else if (UVar3 == '\x02') {
    for (; pUStack_48 < pUVar11; pUStack_48 = pUStack_48 + 1) {
      local_72 = 0;
      ent1B._6_2_ = 0;
      outBit = uVar8;
      while (outBit != 0) {
        FVar6 = outBit;
        if (7 < outBit) {
          FVar6 = 8;
        }
        outBit = outBit - FVar6;
        uVar9 = (short)(1 << ((byte)FVar6 & 0x1f)) - 1;
        ent1B._2_2_ = ent1B._2_2_ + FVar6;
        uVar4 = (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8);
        local_6e = uVar4 & uVar9;
        if (7 < ent1B._2_2_) {
          ent1B._2_2_ = ent1B._2_2_ - 8;
          outPos = outPos + 1;
          if (ent1B._2_2_ != 0) {
            local_6e = uVar9 & (uVar4 | (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8)
                               );
          }
        }
        ent1B._6_2_ = ent1B._6_2_ | local_6e << ((byte)local_72 & 0x1f);
        local_72 = local_72 + FVar6;
      }
      *pUStack_48 = _bitMask[ent1B._6_2_];
    }
  }
  return '\0';
}

Assistant:

static UINT8 Decompress_BitPacking_8(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmpParams)
{
	FUINT8 bitsCmp;
	FUINT8 addVal;
	const UINT8* inPos;
	UINT8* outPos;
	UINT32 outLenMax;
	const UINT8* outDataEnd;
	FUINT8 inVal;
	FUINT8 outVal;
	FUINT8 inShift;
	FUINT8 outShift;
	const UINT8* ent1B;
	
	// ReadBits Variables
	FUINT8 bitsToRead;
	FUINT8 bitReadVal;
	FUINT8 inValB;
	FUINT8 bitMask;
	FUINT8 outBit;
	
	// --- Bit Packing compression --- (8 bit output)
	bitsCmp = cmpParams->bitsCmp;
	addVal = cmpParams->baseVal & 0xFF;
	ent1B = NULL;
	if (cmpParams->subType == 0x02)
	{
		ent1B = cmpParams->comprTbl->values.d8;
		if (! cmpParams->comprTbl->valueCount)
		{
			return 0x10;	// Error: no table loaded
		}
		else if (cmpParams->bitsDec != cmpParams->comprTbl->bitsDec ||
			cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)
		{
			return 0x11;	// Data block and loaded value table incompatible
		}
	}
	
	inShift = 0;
	outShift = cmpParams->bitsDec - bitsCmp;
	outLenMax = MUL_DIV(inLen, 8, cmpParams->bitsCmp);
	if (outLen > outLenMax)
		outLen = outLenMax;
	outDataEnd = outData + outLen;
	
	switch(cmpParams->subType)
	{
	case 0x00:	// Copy
		for (inPos = inData, outPos = outData; outPos < outDataEnd; outPos += 0x01)
		{
			READ_BITS(inPos, inVal, inShift, bitsCmp);
			
			outVal = inVal + addVal;
			*outPos = (UINT8)outVal;
		}
		break;
	case 0x01:	// Shift Left
		for (inPos = inData, outPos = outData; outPos < outDataEnd; outPos += 0x01)
		{
			READ_BITS(inPos, inVal, inShift, bitsCmp);
			
			outVal = (inVal << outShift) + addVal;
			*outPos = (UINT8)outVal;
		}
		break;
	case 0x02:	// Table
		for (inPos = inData, outPos = outData; outPos < outDataEnd; outPos += 0x01)
		{
			READ_BITS(inPos, inVal, inShift, bitsCmp);
			
			*outPos = ent1B[inVal];
		}
		break;
	}
	
	return 0x00;
}